

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O2

ssize_t __thiscall llvm::raw_ostream::write(raw_ostream *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  char local_19;
  
  do {
    pcVar1 = this->OutBufCur;
    if (pcVar1 < this->OutBufEnd) {
LAB_00dbfb34:
      this->OutBufCur = pcVar1 + 1;
      *pcVar1 = (char)__fd;
      return (ssize_t)this;
    }
    if (this->OutBufStart != (char *)0x0) {
      flush_nonempty(this);
      pcVar1 = this->OutBufCur;
      goto LAB_00dbfb34;
    }
    if (this->BufferMode == Unbuffered) {
      local_19 = (char)__fd;
      (*this->_vptr_raw_ostream[8])(this,&local_19,1);
      return (ssize_t)this;
    }
    SetBuffered(this);
  } while( true );
}

Assistant:

raw_ostream &raw_ostream::write(unsigned char C) {
  // Group exceptional cases into a single branch.
  if (LLVM_UNLIKELY(OutBufCur >= OutBufEnd)) {
    if (LLVM_UNLIKELY(!OutBufStart)) {
      if (BufferMode == BufferKind::Unbuffered) {
        write_impl(reinterpret_cast<char*>(&C), 1);
        return *this;
      }
      // Set up a buffer and start over.
      SetBuffered();
      return write(C);
    }

    flush_nonempty();
  }

  *OutBufCur++ = C;
  return *this;
}